

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysdep-unix.c
# Opt level: O0

void create_threads(global_state_t *g,int base,int top)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int status;
  int i;
  uint local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (in_EDX <= (int)local_14) {
      return;
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x28) + (long)(int)local_14 * 0x18 + 0xc) = 1;
    uVar1 = pthread_create((pthread_t *)(**(long **)(in_RDI + 0x18) + (long)(int)local_14 * 8),
                           (pthread_attr_t *)0x0,scheduler_thread_proc_for_system_worker,
                           (void *)(*(long *)(in_RDI + 0x28) + (long)(int)local_14 * 0x18));
    if (uVar1 != 0) break;
    local_14 = local_14 + 1;
  }
  __cilkrts_bug("Cilk runtime error: thread creation (%d) failed: %d\n",(ulong)local_14,(ulong)uVar1
               );
}

Assistant:

static void create_threads(global_state_t *g, int base, int top)
{
    // TBD(11/30/12): We want to insert code providing the option of
    // pinning system workers to cores.
    for (int i = base; i < top; i++) {
        g->worker_thread_args[i].worker_created = 1;
        int status = pthread_create(&g->sysdep->threads[i],
                                    NULL,
                                    scheduler_thread_proc_for_system_worker,
                                    &g->worker_thread_args[i]);
        if (status != 0)
            __cilkrts_bug("Cilk runtime error: thread creation (%d) failed: %d\n", i, status);
    }
}